

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
CTxMemPool::CheckConflictTopology_abi_cxx11_
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,CTxMemPool *this,setEntries *direct_conflicts)

{
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  long in_FS_OFFSET;
  __shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var4 = (direct_conflicts->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == &(direct_conflicts->_M_t)._M_impl.super__Rb_tree_header) {
      (__return_storage_ptr__->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
LAB_0089ed81:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        return __return_storage_ptr__;
      }
      __stack_chk_fail();
    }
    p_Var1 = *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)(p_Var4 + 1);
    p_Var2 = p_Var1[0xc]._M_refcount._M_pi;
    peVar3 = p_Var1[0xe]._M_ptr;
    std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)&local_78,p_Var1);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_58,(base_blob<256u> *)(local_78._M_dataplus._M_p + 0x39));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_78._M_string_length);
    if ((element_type *)0x2 < peVar3) {
      local_98._M_dataplus._M_p = &peVar3[-1].field_0x7f;
      tinyformat::format<std::__cxx11::string,unsigned_long>
                (&local_78,(tinyformat *)"%s has %u ancestors, max 1 allowed",(char *)&local_58,
                 &local_98,(unsigned_long *)in_R8);
LAB_0089ed5a:
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
LAB_0089ed77:
      std::__cxx11::string::~string((string *)&local_58);
      goto LAB_0089ed81;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2 < p_Var2) {
      local_98._M_dataplus._M_p = (pointer)((long)&p_Var2[-1]._M_weak_count + 3);
      tinyformat::format<std::__cxx11::string,unsigned_long>
                (&local_78,(tinyformat *)"%s has %u descendants, max 1 allowed",(char *)&local_58,
                 &local_98,(unsigned_long *)in_R8);
      goto LAB_0089ed5a;
    }
    in_RCX = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT71((int7)((ulong)in_RCX >> 8),
                      peVar3 < (element_type *)0x2 ||
                      p_Var2 < (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2);
    if (peVar3 >= (element_type *)0x2 &&
        p_Var2 >= (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2) {
      tinyformat::format<std::__cxx11::string>
                (&local_78,
                 (tinyformat *)"%s has both ancestor and descendant, exceeding cluster limit of 2",
                 (char *)&local_58,in_RCX);
      goto LAB_0089ed5a;
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&DAT_00000001 < p_Var2) {
      p_Var1 = *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)
                (*(long *)(*(long *)(p_Var4 + 1) + 0x58) + 0x20);
      if (p_Var1[0xe]._M_ptr < (element_type *)0x3) goto LAB_0089ecd8;
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a8,p_Var1);
      base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)&(local_a8._M_ptr)->hash);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_78,(tinyformat *)"%s is not the only parent of child %s",(char *)&local_58,
                 &local_98,in_R8);
LAB_0089ee2b:
      std::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                (__return_storage_ptr__,&local_78);
      std::__cxx11::string::~string((string *)&local_78);
      std::__cxx11::string::~string((string *)&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a8._M_refcount);
      goto LAB_0089ed77;
    }
    if (((element_type *)0x1 < peVar3) &&
       (p_Var1 = *(__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> **)
                  (*(long *)(*(long *)(p_Var4 + 1) + 0x28) + 0x20),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x2 < p_Var1[0xc]._M_refcount._M_pi)) {
      std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_a8,p_Var1);
      base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)&(local_a8._M_ptr)->hash);
      tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                (&local_78,(tinyformat *)"%s is not the only child of parent %s",(char *)&local_58,
                 &local_98,in_R8);
      goto LAB_0089ee2b;
    }
LAB_0089ecd8:
    std::__cxx11::string::~string((string *)&local_58);
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var4);
  } while( true );
}

Assistant:

std::optional<std::string> CTxMemPool::CheckConflictTopology(const setEntries& direct_conflicts)
{
    for (const auto& direct_conflict : direct_conflicts) {
        // Ancestor and descendant counts are inclusive of the tx itself.
        const auto ancestor_count{direct_conflict->GetCountWithAncestors()};
        const auto descendant_count{direct_conflict->GetCountWithDescendants()};
        const bool has_ancestor{ancestor_count > 1};
        const bool has_descendant{descendant_count > 1};
        const auto& txid_string{direct_conflict->GetSharedTx()->GetHash().ToString()};
        // The only allowed configurations are:
        // 1 ancestor and 0 descendant
        // 0 ancestor and 1 descendant
        // 0 ancestor and 0 descendant
        if (ancestor_count > 2) {
            return strprintf("%s has %u ancestors, max 1 allowed", txid_string, ancestor_count - 1);
        } else if (descendant_count > 2) {
            return strprintf("%s has %u descendants, max 1 allowed", txid_string, descendant_count - 1);
        } else if (has_ancestor && has_descendant) {
            return strprintf("%s has both ancestor and descendant, exceeding cluster limit of 2", txid_string);
        }
        // Additionally enforce that:
        // If we have a child,  we are its only parent.
        // If we have a parent, we are its only child.
        if (has_descendant) {
            const auto& our_child = direct_conflict->GetMemPoolChildrenConst().begin();
            if (our_child->get().GetCountWithAncestors() > 2) {
                return strprintf("%s is not the only parent of child %s",
                                 txid_string, our_child->get().GetSharedTx()->GetHash().ToString());
            }
        } else if (has_ancestor) {
            const auto& our_parent = direct_conflict->GetMemPoolParentsConst().begin();
            if (our_parent->get().GetCountWithDescendants() > 2) {
                return strprintf("%s is not the only child of parent %s",
                                 txid_string, our_parent->get().GetSharedTx()->GetHash().ToString());
            }
        }
    }
    return std::nullopt;
}